

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddUnate.c
# Opt level: O0

DdNode * extraZddGetSingletonsBoth(DdManager *dd,DdNode *bVars)

{
  DdNode *pDVar1;
  DdNode *Q;
  DdNode *P;
  DdNode *zPlus;
  DdNode *zTemp;
  DdNode *zRes;
  DdNode *bVars_local;
  DdManager *dd_local;
  
  if (bVars == dd->one) {
    dd_local = (DdManager *)dd->one;
  }
  else {
    dd_local = (DdManager *)cuddCacheLookup1Zdd(dd,extraZddGetSingletonsBoth,bVars);
    if (dd_local == (DdManager *)0x0) {
      pDVar1 = extraZddGetSingletonsBoth(dd,(bVars->type).kids.T);
      if (pDVar1 == (DdNode *)0x0) {
        dd_local = (DdManager *)0x0;
      }
      else {
        *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) + 1;
        Q = cuddZddGetNode(dd,bVars->index * 2 + 1,dd->one,dd->zero);
        if (Q == (DdNode *)0x0) {
          Cudd_RecursiveDerefZdd(dd,pDVar1);
          dd_local = (DdManager *)0x0;
        }
        else {
          *(int *)(((ulong)Q & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)Q & 0xfffffffffffffffe) + 4) + 1;
          P = cuddZddUnion(dd,pDVar1,Q);
          if (P == (DdNode *)0x0) {
            Cudd_RecursiveDerefZdd(dd,pDVar1);
            Cudd_RecursiveDerefZdd(dd,Q);
            dd_local = (DdManager *)0x0;
          }
          else {
            *(int *)(((ulong)P & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)P & 0xfffffffffffffffe) + 4) + 1;
            Cudd_RecursiveDerefZdd(dd,pDVar1);
            Cudd_RecursiveDerefZdd(dd,Q);
            pDVar1 = cuddZddGetNode(dd,bVars->index << 1,dd->one,dd->zero);
            if (pDVar1 == (DdNode *)0x0) {
              Cudd_RecursiveDerefZdd(dd,P);
              dd_local = (DdManager *)0x0;
            }
            else {
              *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) =
                   *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) + 1;
              dd_local = (DdManager *)cuddZddUnion(dd,P,pDVar1);
              if (dd_local == (DdManager *)0x0) {
                Cudd_RecursiveDerefZdd(dd,P);
                Cudd_RecursiveDerefZdd(dd,pDVar1);
                dd_local = (DdManager *)0x0;
              }
              else {
                *(int *)(((ulong)dd_local & 0xfffffffffffffffe) + 4) =
                     *(int *)(((ulong)dd_local & 0xfffffffffffffffe) + 4) + 1;
                Cudd_RecursiveDerefZdd(dd,P);
                Cudd_RecursiveDerefZdd(dd,pDVar1);
                *(int *)(((ulong)dd_local & 0xfffffffffffffffe) + 4) =
                     *(int *)(((ulong)dd_local & 0xfffffffffffffffe) + 4) + -1;
                cuddCacheInsert1(dd,extraZddGetSingletonsBoth,bVars,(DdNode *)dd_local);
              }
            }
          }
        }
      }
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode * extraZddGetSingletonsBoth( 
  DdManager * dd,    /* the DD manager */
  DdNode * bVars)    /* the set of variables */
{
    DdNode * zRes;

    if ( bVars == b1 )
        return z1;

    if ( (zRes = cuddCacheLookup1Zdd(dd, extraZddGetSingletonsBoth, bVars)) )
        return zRes;
    else
    {
        DdNode * zTemp, * zPlus;          

        // solve subproblem
        zRes = extraZddGetSingletonsBoth( dd, cuddT(bVars) );
        if ( zRes == NULL ) 
            return NULL;
        cuddRef( zRes );

        
        // create the negative singleton
        zPlus = cuddZddGetNode( dd, 2*bVars->index+1, z1, z0 );
        if ( zPlus == NULL ) 
        {
            Cudd_RecursiveDerefZdd( dd, zRes );
            return NULL;
        }
        cuddRef( zPlus );

        // add these to the result
        zRes = cuddZddUnion( dd, zTemp = zRes, zPlus );
        if ( zRes == NULL )
        {
            Cudd_RecursiveDerefZdd( dd, zTemp );
            Cudd_RecursiveDerefZdd( dd, zPlus );
            return NULL;
        }
        cuddRef( zRes );
        Cudd_RecursiveDerefZdd( dd, zTemp );
        Cudd_RecursiveDerefZdd( dd, zPlus );
        

        // create the positive singleton
        zPlus = cuddZddGetNode( dd, 2*bVars->index, z1, z0 );
        if ( zPlus == NULL ) 
        {
            Cudd_RecursiveDerefZdd( dd, zRes );
            return NULL;
        }
        cuddRef( zPlus );

        // add these to the result
        zRes = cuddZddUnion( dd, zTemp = zRes, zPlus );
        if ( zRes == NULL )
        {
            Cudd_RecursiveDerefZdd( dd, zTemp );
            Cudd_RecursiveDerefZdd( dd, zPlus );
            return NULL;
        }
        cuddRef( zRes );
        Cudd_RecursiveDerefZdd( dd, zTemp );
        Cudd_RecursiveDerefZdd( dd, zPlus );

        cuddDeref( zRes );
        cuddCacheInsert1( dd, extraZddGetSingletonsBoth, bVars, zRes );
        return zRes;
    }
}